

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O2

int CfdIsFindPsbtPubkeyRecord(void *handle,void *psbt_handle,int kind,uint32_t index,char *pubkey)

{
  bool bVar1;
  CfdException *pCVar2;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_238;
  int kind_local;
  ByteData key;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_200;
  ExtPubkey local_1e8;
  KeyData pk_obj;
  
  kind_local = kind;
  cfd::Initialize();
  std::__cxx11::string::string((string *)&pk_obj,"PsbtHandle",(allocator *)&local_1e8);
  cfd::capi::CheckBuffer(psbt_handle,(string *)&pk_obj);
  std::__cxx11::string::~string((string *)&pk_obj);
  if (pubkey == (char *)0x0) {
    pk_obj.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
    pk_obj.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x642;
    pk_obj.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdIsFindPsbtPubkeyRecord";
    cfd::core::logger::warn<>((CfdSourceLocation *)&pk_obj,"pubkey is null.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&pk_obj,"Failed to parameter. pubkey is null.",(allocator *)&local_1e8);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&pk_obj);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)((long)psbt_handle + 0x18) == 0) {
    pk_obj.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
    pk_obj.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x648;
    pk_obj.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdIsFindPsbtPubkeyRecord";
    cfd::core::logger::warn<>((CfdSourceLocation *)&pk_obj,"psbt is null.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&pk_obj,"Failed to handle statement. psbt is null.",(allocator *)&local_1e8
              );
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)&pk_obj);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::capi::ParsePubkey(&pk_obj,kind,pubkey,*(NetType *)((long)psbt_handle + 0x10));
  cfd::core::ByteData::ByteData(&key);
  switch(kind) {
  case 1:
    cfd::core::KeyData::GetPubkey((Pubkey *)&_Stack_238,&pk_obj);
    cfd::core::Psbt::CreatePubkeyRecordKey(&local_1e8.serialize_data_,'\x02',(Pubkey *)&_Stack_238);
    break;
  case 2:
    cfd::core::KeyData::GetPubkey((Pubkey *)&_Stack_238,&pk_obj);
    cfd::core::Psbt::CreatePubkeyRecordKey(&local_1e8.serialize_data_,'\x06',(Pubkey *)&_Stack_238);
    break;
  case 3:
    cfd::core::KeyData::GetPubkey((Pubkey *)&_Stack_238,&pk_obj);
    cfd::core::Psbt::CreatePubkeyRecordKey(&local_1e8.serialize_data_,'\x02',(Pubkey *)&_Stack_238);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&key,&local_1e8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1e8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_238);
    bVar1 = cfd::core::Psbt::IsFindTxOutRecord(*(Psbt **)((long)psbt_handle + 0x18),index,&key);
    goto LAB_0038a169;
  case 4:
    cfd::core::KeyData::GetExtPubkey(&local_1e8,&pk_obj);
    cfd::core::ExtPubkey::GetData((ByteData *)&local_200,&local_1e8);
    cfd::core::Psbt::CreateFixRecordKey((ByteData *)&_Stack_238,'\x01',(ByteData *)&local_200);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&key,&_Stack_238);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_238);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_200);
    cfd::core::ExtPubkey::~ExtPubkey(&local_1e8);
    bVar1 = cfd::core::Psbt::IsFindGlobalRecord(*(Psbt **)((long)psbt_handle + 0x18),&key);
    goto LAB_0038a169;
  default:
    local_1e8.serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
    local_1e8.serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x667;
    local_1e8.serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdIsFindPsbtPubkeyRecord";
    cfd::core::logger::warn<int&>((CfdSourceLocation *)&local_1e8,"kind is invalid: {}",&kind_local)
    ;
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_1e8,"Failed to parameter. kind is invalid.",(allocator *)&_Stack_238
              );
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&local_1e8);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&key,&local_1e8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1e8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_238);
  bVar1 = cfd::core::Psbt::IsFindTxInRecord(*(Psbt **)((long)psbt_handle + 0x18),index,&key);
LAB_0038a169:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
  cfd::core::KeyData::~KeyData(&pk_obj);
  return (uint)(bVar1 ^ 1) << 3;
}

Assistant:

int CfdIsFindPsbtPubkeyRecord(
    void* handle, void* psbt_handle, int kind, uint32_t index,
    const char* pubkey) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (pubkey == nullptr) {
      warn(CFD_LOG_SOURCE, "pubkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    KeyData pk_obj = ParsePubkey(kind, pubkey, psbt_obj->net_type);
    ByteData key;
    bool is_find = true;
    switch (kind) {
      case kCfdPsbtRecordInputSignature:
        key = Psbt::CreatePubkeyRecordKey(
            Psbt::kPsbtInputPartialSig, pk_obj.GetPubkey());
        is_find = psbt_obj->psbt->IsFindTxInRecord(index, key);
        break;
      case kCfdPsbtRecordInputBip32:
        key = Psbt::CreatePubkeyRecordKey(
            Psbt::kPsbtInputBip32Derivation, pk_obj.GetPubkey());
        is_find = psbt_obj->psbt->IsFindTxInRecord(index, key);
        break;
      case kCfdPsbtRecordOutputBip32:
        key = Psbt::CreatePubkeyRecordKey(
            Psbt::kPsbtOutputBip32Derivation, pk_obj.GetPubkey());
        is_find = psbt_obj->psbt->IsFindTxOutRecord(index, key);
        break;
      case kCfdPsbtRecordGloalXpub:
        key = Psbt::CreateFixRecordKey(
            Psbt::kPsbtGlobalXpub, pk_obj.GetExtPubkey().GetData());
        is_find = psbt_obj->psbt->IsFindGlobalRecord(key);
        break;
      default:
        warn(CFD_LOG_SOURCE, "kind is invalid: {}", kind);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. kind is invalid.");
    }

    if (!is_find) return CfdErrorCode::kCfdNotFoundError;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}